

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_block_allocator.cpp
# Opt level: O2

void __thiscall foxxll::disk_block_allocator::dump(disk_block_allocator *this)

{
  _Base_ptr p_Var1;
  Logger LStack_1a8;
  
  p_Var1 = (this->free_space_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tlx::Logger::Logger(&LStack_1a8);
  std::operator<<((ostream *)&LStack_1a8,"Free regions dump:");
  tlx::Logger::~Logger(&LStack_1a8);
  for (; (_Rb_tree_header *)p_Var1 != &(this->free_space_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    tlx::Logger::Logger(&LStack_1a8);
    std::operator<<((ostream *)&LStack_1a8,"Free chunk: begin: ");
    tlx::LoggerFormatter<unsigned_long,_void>::print
              ((ostream *)&LStack_1a8,(unsigned_long *)(p_Var1 + 1));
    std::operator<<((ostream *)&LStack_1a8," size: ");
    tlx::LoggerFormatter<unsigned_long,_void>::print
              ((ostream *)&LStack_1a8,(unsigned_long *)&p_Var1[1]._M_parent);
    tlx::Logger::~Logger(&LStack_1a8);
  }
  tlx::Logger::Logger(&LStack_1a8);
  std::operator<<((ostream *)&LStack_1a8,"Total bytes: ");
  std::ostream::_M_insert<unsigned_long>((ulong)&LStack_1a8);
  tlx::Logger::~Logger(&LStack_1a8);
  return;
}

Assistant:

void disk_block_allocator::dump() const
{
    uint64_t total = 0;
    space_map_type::const_iterator cur = free_space_.begin();
    TLX_LOG1 << "Free regions dump:";
    for ( ; cur != free_space_.end(); ++cur)
    {
        TLX_LOG1 << "Free chunk: begin: " << (cur->first) << " size: " << (cur->second);
        total += cur->second;
    }
    TLX_LOG1 << "Total bytes: " << total;
}